

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_functions.cpp
# Opt level: O0

ScalarFunction * duckdb::CurrentTransactionIdFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  ScalarFunction *txid_current;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  LogicalType local_88 [24];
  undefined1 local_70 [48];
  LogicalType local_40 [24];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined1 local_9;
  
  local_9 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0xd342e8);
  duckdb::LogicalType::LogicalType(local_40,UBIGINT);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
            );
  duckdb::LogicalType::LogicalType(local_88,INVALID);
  duckdb::ScalarFunction::ScalarFunction(in_RDI,&local_28,local_40,local_70,0,0,0,0,local_88,0,0,0);
  duckdb::LogicalType::~LogicalType(local_88);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xd34389);
  duckdb::LogicalType::~LogicalType(local_40);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xd343a3);
  in_RDI->field_0xa8 = 2;
  return in_RDI;
}

Assistant:

ScalarFunction CurrentTransactionIdFun::GetFunction() {
	ScalarFunction txid_current({}, LogicalType::UBIGINT, TransactionIdCurrent);
	txid_current.stability = FunctionStability::CONSISTENT_WITHIN_QUERY;
	return txid_current;
}